

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdef.c
# Opt level: O1

int mdef_phone_id(mdef_t *m,int ci,int lc,int rc,word_posn_t wpos)

{
  short sVar1;
  int iVar2;
  uint uVar3;
  ph_lc_t *lcptr;
  ph_lc_t *ppVar4;
  uint uVar5;
  bool bVar6;
  
  do {
    uVar5 = rc;
    if (m == (mdef_t *)0x0) {
      __assert_fail("m",
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/mdef.c"
                    ,0xdf,"int mdef_phone_id(mdef_t *, int, int, int, word_posn_t)");
    }
    if ((ci < 0) || (iVar2 = m->n_ciphone, iVar2 <= ci)) {
      __assert_fail("(ci >= 0) && (ci < m->n_ciphone)",
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/mdef.c"
                    ,0xe0,"int mdef_phone_id(mdef_t *, int, int, int, word_posn_t)");
    }
    if ((lc < 0) || (iVar2 <= lc)) {
      __assert_fail("(lc >= 0) && (lc < m->n_ciphone)",
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/mdef.c"
                    ,0xe1,"int mdef_phone_id(mdef_t *, int, int, int, word_posn_t)");
    }
    if (((int)uVar5 < 0) || (iVar2 <= (int)uVar5)) {
      __assert_fail("(rc >= 0) && (rc < m->n_ciphone)",
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/mdef.c"
                    ,0xe2,"int mdef_phone_id(mdef_t *, int, int, int, word_posn_t)");
    }
    if (WORD_POSN_SINGLE < wpos) {
      __assert_fail("(wpos >= 0) && (wpos < N_WORD_POSN)",
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/mdef.c"
                    ,0xe3,"int mdef_phone_id(mdef_t *, int, int, int, word_posn_t)");
    }
    for (ppVar4 = m->wpos_ci_lclist[wpos][(uint)ci];
        (ppVar4 != (ph_lc_t *)0x0 && (ppVar4->lc != lc)); ppVar4 = ppVar4->next) {
    }
    if (ppVar4 != (ph_lc_t *)0x0) {
      do {
        ppVar4 = (ph_lc_t *)ppVar4->rclist;
        if (ppVar4 == (ph_lc_t *)0x0) break;
      } while ((int)ppVar4->lc != uVar5);
      if (ppVar4 != (ph_lc_t *)0x0) {
        return *(int *)&ppVar4->field_0x4;
      }
    }
    sVar1 = m->sil;
    if (sVar1 < 0) {
      return -1;
    }
    uVar3 = (int)sVar1;
    if (m->ciphone[(uint)lc].filler == 0) {
      uVar3 = lc;
    }
    rc = (int)sVar1;
    if (m->ciphone[uVar5].filler == 0) {
      rc = uVar5;
    }
    bVar6 = uVar3 == lc;
    lc = uVar3;
    if ((bVar6) && (rc == uVar5)) {
      return -1;
    }
  } while( true );
}

Assistant:

int
mdef_phone_id(mdef_t * m,
              int ci, int lc, int rc, word_posn_t wpos)
{
    ph_lc_t *lcptr;
    ph_rc_t *rcptr;
    int newl, newr;

    assert(m);
    assert((ci >= 0) && (ci < m->n_ciphone));
    assert((lc >= 0) && (lc < m->n_ciphone));
    assert((rc >= 0) && (rc < m->n_ciphone));
    assert((wpos >= 0) && (wpos < N_WORD_POSN));

    if (((lcptr =
          find_ph_lc(m->wpos_ci_lclist[wpos][(int) ci], lc)) == NULL)
        || ((rcptr = find_ph_rc(lcptr->rclist, rc)) == NULL)) {
        /* Not found; backoff to silence context if non-silence filler context */
        if (m->sil < 0)
            return -1;

        newl = m->ciphone[(int) lc].filler ? m->sil : lc;
        newr = m->ciphone[(int) rc].filler ? m->sil : rc;
        if ((newl == lc) && (newr == rc))
            return -1;

        return (mdef_phone_id(m, ci, newl, newr, wpos));
    }

    return (rcptr->pid);
}